

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::ArrayBuilder<char32_t>::~ArrayBuilder(ArrayBuilder<char32_t> *this)

{
  char32_t *pcVar1;
  RemoveConst<char32_t> *pRVar2;
  char32_t *pcVar3;
  
  pcVar1 = this->ptr;
  if (pcVar1 != (char32_t *)0x0) {
    pRVar2 = this->pos;
    pcVar3 = this->endPtr;
    this->ptr = (char32_t *)0x0;
    this->pos = (RemoveConst<char32_t> *)0x0;
    this->endPtr = (char32_t *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pcVar1,4,(long)pRVar2 - (long)pcVar1 >> 2,
               (long)pcVar3 - (long)pcVar1 >> 2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }